

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O3

UBool ucm_separateMappings(UCMFile *ucm,UBool isSISO)

{
  UCMTable *pUVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  UBool UVar5;
  int32_t iVar6;
  UChar32 *in_RDX;
  UChar32 *extraout_RDX;
  UChar32 *extraout_RDX_00;
  anon_union_4_2_095b93d3_for_b *paVar7;
  UChar32 *extraout_RDX_01;
  UCMapping *pUVar8;
  UCMapping *codePoints;
  UCMapping *pUVar9;
  UCMapping *m;
  
  pUVar1 = ucm->base;
  if ((long)pUVar1->mappingsLength < 1) {
LAB_001e07b3:
    ucm_sortTable(ucm->base);
    UVar5 = '\x01';
  }
  else {
    pUVar8 = pUVar1->mappings + pUVar1->mappingsLength;
    bVar4 = false;
    bVar2 = false;
    m = pUVar1->mappings;
    do {
      while (((pUVar9 = m + 1, isSISO != '\0' && (m->bLen == '\x01')) &&
             (((m->b).bytes[0] & 0xfe) == 0xe))) {
        ucm_separateMappings_cold_1();
        bVar3 = 2;
        in_RDX = extraout_RDX_00;
LAB_001e06f8:
        m->moveFlag = m->moveFlag | bVar3;
        bVar2 = true;
LAB_001e06ff:
        m = pUVar9;
        if (pUVar8 <= pUVar9) {
          if (!bVar4) {
            if (bVar2) {
              ucm_moveMappings(ucm->base,ucm->ext);
              UVar5 = ucm_checkBaseExt(&ucm->states,ucm->base,ucm->ext,ucm->ext,'\0');
              return UVar5;
            }
            goto LAB_001e07b3;
          }
          goto LAB_001e0776;
        }
      }
      if (m->bLen < '\x05') {
        paVar7 = &m->b;
      }
      else {
        paVar7 = (anon_union_4_2_095b93d3_for_b *)(pUVar1->bytes + (m->b).idx);
      }
      iVar6 = ucm_mappingType(&ucm->states,m,in_RDX,paVar7->bytes);
      if (-1 < iVar6) {
        bVar3 = 1;
        in_RDX = extraout_RDX;
        if (iVar6 != 0) goto LAB_001e06f8;
        goto LAB_001e06ff;
      }
      codePoints = m;
      if (m->uLen != '\x01') {
        codePoints = (UCMapping *)(pUVar1->codePoints + m->u);
      }
      if (m->bLen < '\x05') {
        paVar7 = &m->b;
      }
      else {
        paVar7 = (anon_union_4_2_095b93d3_for_b *)(pUVar1->bytes + (m->b).idx);
      }
      printMapping(m,&codePoints->u,paVar7->bytes,_stderr);
      bVar4 = true;
      in_RDX = extraout_RDX_01;
      m = pUVar9;
    } while (pUVar9 < pUVar8);
LAB_001e0776:
    UVar5 = '\0';
  }
  return UVar5;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucm_separateMappings(UCMFile *ucm, UBool isSISO) {
    UCMTable *table;
    UCMapping *m, *mLimit;
    int32_t type;
    UBool needsMove, isOK;

    table=ucm->base;
    m=table->mappings;
    mLimit=m+table->mappingsLength;

    needsMove=FALSE;
    isOK=TRUE;

    for(; m<mLimit; ++m) {
        if(isSISO && m->bLen==1 && (m->b.bytes[0]==0xe || m->b.bytes[0]==0xf)) {
            fprintf(stderr, "warning: removing illegal mapping from an SI/SO-stateful table\n");
            ucm_printMapping(table, m, stderr);
            m->moveFlag|=UCM_REMOVE_MAPPING;
            needsMove=TRUE;
            continue;
        }

        type=ucm_mappingType(
                &ucm->states, m,
                UCM_GET_CODE_POINTS(table, m), UCM_GET_BYTES(table, m));
        if(type<0) {
            /* illegal byte sequence */
            printMapping(m, UCM_GET_CODE_POINTS(table, m), UCM_GET_BYTES(table, m), stderr);
            isOK=FALSE;
        } else if(type>0) {
            m->moveFlag|=UCM_MOVE_TO_EXT;
            needsMove=TRUE;
        }
    }

    if(!isOK) {
        return FALSE;
    }
    if(needsMove) {
        ucm_moveMappings(ucm->base, ucm->ext);
        return ucm_checkBaseExt(&ucm->states, ucm->base, ucm->ext, ucm->ext, FALSE);
    } else {
        ucm_sortTable(ucm->base);
        return TRUE;
    }
}